

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::gatherArray2DOffsetsCompare
          (tcu *this,ConstPixelBufferAccess *src,Sampler *sampler,float ref,float s,float t,
          int depth,IVec2 (*offsets) [4])

{
  CompareMode CVar1;
  TextureChannelClass TVar2;
  long lVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  float fVar8;
  Vec4 VVar9;
  Vec4 gathered;
  tcu local_40 [16];
  
  TVar2 = getTextureChannelClass((src->m_format).type);
  lVar3 = 0;
  fetchGatherArray2DOffsets(local_40,src,sampler,s,t,depth,0,offsets);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  CVar1 = sampler->compare;
  fVar5 = 1.0;
  if (ref <= 1.0) {
    fVar5 = ref;
  }
  do {
    fVar6 = *(float *)(local_40 + lVar3 * 4);
    fVar8 = ref;
    if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      fVar8 = 1.0;
      if (fVar6 <= 1.0) {
        fVar8 = fVar6;
      }
      fVar6 = (float)(~-(uint)(fVar6 < 0.0) & (uint)fVar8);
      fVar8 = (float)(~-(uint)(ref < 0.0) & (uint)fVar5);
    }
    switch(CVar1) {
    case COMPAREMODE_LESS:
      bVar4 = fVar6 < fVar8;
      goto LAB_019f0305;
    case COMPAREMODE_LESS_OR_EQUAL:
      bVar4 = fVar6 < fVar8;
      goto LAB_019f0316;
    case COMPAREMODE_GREATER:
      bVar4 = fVar8 < fVar6;
LAB_019f0305:
      bVar4 = !bVar4 && fVar8 != fVar6;
      break;
    case COMPAREMODE_GREATER_OR_EQUAL:
      bVar4 = fVar8 < fVar6;
LAB_019f0316:
      bVar4 = !bVar4;
      break;
    case COMPAREMODE_EQUAL:
      bVar4 = fVar8 == fVar6;
      break;
    case COMPAREMODE_NOT_EQUAL:
      bVar4 = fVar8 != fVar6;
      break;
    case COMPAREMODE_ALWAYS:
      bVar4 = true;
      break;
    default:
      bVar4 = false;
    }
    uVar7 = 0x3f800000;
    if (!bVar4) {
      uVar7 = 0;
    }
    *(undefined4 *)(this + lVar3 * 4) = uVar7;
    lVar3 = lVar3 + 1;
    if (lVar3 == 4) {
      VVar9.m_data[3] = 0.0;
      VVar9.m_data[0] = 1.0;
      VVar9.m_data[1] = 0.0;
      VVar9.m_data[2] = 0.0;
      return (Vec4)VVar9.m_data;
    }
  } while( true );
}

Assistant:

Vec4 gatherArray2DOffsetsCompare (const ConstPixelBufferAccess& src, const Sampler& sampler, float ref, float s, float t, int depth, const IVec2 (&offsets)[4])
{
	DE_ASSERT(sampler.compare != Sampler::COMPAREMODE_NONE);
	DE_ASSERT(src.getFormat().order == TextureFormat::D || src.getFormat().order == TextureFormat::DS);
	DE_ASSERT(sampler.compareChannel == 0);

	const bool	isFixedPoint	= isFixedPointDepthTextureFormat(src.getFormat());
	const Vec4	gathered		= fetchGatherArray2DOffsets(src, sampler, s, t, depth, 0 /* component 0: depth */, offsets);
	Vec4		result;

	for (int i = 0; i < 4; i++)
		result[i] = execCompare(gathered, sampler.compare, i, ref, isFixedPoint);

	return result;
}